

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FusionEKF.cpp
# Opt level: O1

void __thiscall FusionEKF::ProcessMeasurement(FusionEKF *this,MeasurementPackage *measurement_pack)

{
  KalmanFilter *this_00;
  VectorXd *pVVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  double *pdVar6;
  MatrixXd *__ptr;
  DenseIndex DVar7;
  DenseIndex DVar8;
  Matrix<double,__1,__1,_0,__1,__1> *pMVar9;
  double dVar10;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar11;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar12;
  ostream *poVar13;
  char *__function;
  float fVar14;
  float fVar15;
  Tools tools;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_e8;
  double local_c0;
  Tools local_b8;
  double local_b0;
  Scalar local_a8;
  double local_a0;
  Scalar local_98;
  Scalar local_90;
  Scalar local_88;
  Scalar local_80;
  Scalar local_78;
  Scalar local_70;
  Scalar local_68;
  Scalar local_60;
  Scalar local_58;
  Scalar local_50;
  Scalar local_48;
  Scalar local_40;
  Scalar local_38;
  
  if (this->is_initialized_ == false) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"EKF: ",5);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
              ((DenseStorage<double,__1,__1,_1,_0> *)&local_e8,4,4,1);
    pVVar1 = &(this->ekf_).x_;
    pMVar9 = (Matrix<double,__1,__1,_0,__1,__1> *)
             (this->ekf_).x_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data;
    (this->ekf_).x_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
         = (double *)local_e8.m_xpr;
    DVar7 = (this->ekf_).x_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
            .m_rows;
    (this->ekf_).x_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
         = local_e8.m_row;
    local_e8.m_xpr = pMVar9;
    local_e8.m_row = DVar7;
    free(pMVar9);
    local_e8.m_row = 0;
    local_e8.m_col = 1;
    local_e8.m_currentBlockRows = 1;
    *(this->ekf_).x_.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
         = 1.0;
    local_b8._vptr_Tools = (_func_int **)0x3ff0000000000000;
    local_e8.m_xpr = (Matrix<double,__1,__1,_0,__1,__1> *)pVVar1;
    pCVar12 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                        ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_e8,
                         (Scalar *)&local_b8);
    local_a8 = 1.0;
    pCVar12 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                        (pCVar12,&local_a8);
    local_98 = 1.0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar12,&local_98);
    if ((local_e8.m_currentBlockRows + local_e8.m_row !=
         ((local_e8.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
         m_storage.m_rows) || (local_e8.m_col != 1)) {
LAB_00104853:
      __function = 
      "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::finished() [MatrixType = Eigen::Matrix<double, -1, 1>]"
      ;
      goto LAB_00104868;
    }
    local_e8.m_xpr = (Matrix<double,__1,__1,_0,__1,__1> *)0x0;
    local_e8.m_row = 0;
    local_e8.m_col = 0;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)&local_e8,0x10,4,4);
    pMVar9 = (Matrix<double,__1,__1,_0,__1,__1> *)
             (this->ekf_).P_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_data;
    (this->ekf_).P_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_data = (double *)local_e8.m_xpr;
    DVar7 = (this->ekf_).P_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_rows;
    (this->ekf_).P_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_rows = local_e8.m_row;
    DVar8 = (this->ekf_).P_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_cols;
    (this->ekf_).P_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_cols = local_e8.m_col;
    local_e8.m_xpr = pMVar9;
    local_e8.m_row = DVar7;
    local_e8.m_col = DVar8;
    free(pMVar9);
    local_e8.m_xpr = (Matrix<double,__1,__1,_0,__1,__1> *)0x0;
    local_e8.m_row = 0;
    local_e8.m_col = 0;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)&local_e8,0x10,4,4);
    pMVar9 = (Matrix<double,__1,__1,_0,__1,__1> *)
             (this->ekf_).F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_data;
    (this->ekf_).F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_data = (double *)local_e8.m_xpr;
    DVar7 = (this->ekf_).F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_rows;
    (this->ekf_).F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_rows = local_e8.m_row;
    DVar8 = (this->ekf_).F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_cols;
    (this->ekf_).F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_cols = local_e8.m_col;
    local_e8.m_xpr = pMVar9;
    local_e8.m_row = DVar7;
    local_e8.m_col = DVar8;
    free(pMVar9);
    local_e8.m_xpr = (Matrix<double,__1,__1,_0,__1,__1> *)0x0;
    local_e8.m_row = 0;
    local_e8.m_col = 0;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)&local_e8,0x10,4,4);
    pMVar9 = (Matrix<double,__1,__1,_0,__1,__1> *)
             (this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_data;
    (this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_data = (double *)local_e8.m_xpr;
    DVar7 = (this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_rows;
    (this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_rows = local_e8.m_row;
    DVar8 = (this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_cols;
    (this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
    m_cols = local_e8.m_col;
    local_e8.m_xpr = pMVar9;
    local_e8.m_row = DVar7;
    local_e8.m_col = DVar8;
    free(pMVar9);
    local_e8.m_row = 0;
    local_e8.m_col = 1;
    local_e8.m_currentBlockRows = 1;
    *(this->ekf_).F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
     m_data = 1.0;
    local_b8._vptr_Tools = (_func_int **)0x0;
    local_e8.m_xpr = &(this->ekf_).F_;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (&local_e8,(Scalar *)&local_b8);
    local_a8 = 1.0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar11,&local_a8);
    local_98 = 0.0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar11,&local_98);
    local_38 = 0.0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar11,&local_38);
    local_40 = 1.0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar11,&local_40);
    local_48 = 0.0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar11,&local_48);
    local_50 = 1.0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar11,&local_50);
    local_58 = 0.0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar11,&local_58);
    local_60 = 0.0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar11,&local_60);
    local_68 = 1.0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar11,&local_68);
    local_70 = 0.0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar11,&local_70);
    local_78 = 0.0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar11,&local_78);
    local_80 = 0.0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar11,&local_80);
    local_88 = 0.0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar11,&local_88);
    local_90 = 1.0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar11,&local_90)
    ;
    if (((local_e8.m_currentBlockRows + local_e8.m_row ==
          ((local_e8.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
          m_storage.m_rows) ||
        (((local_e8.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
         m_storage.m_cols == 0)) &&
       (local_e8.m_col ==
        ((local_e8.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
        m_storage.m_cols)) {
      local_e8.m_xpr = &(this->ekf_).P_;
      local_e8.m_row = 0;
      local_e8.m_col = 1;
      local_e8.m_currentBlockRows = 1;
      *((local_e8.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
       m_storage.m_data = 1.0;
      local_b8._vptr_Tools = (_func_int **)0x0;
      pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                          (&local_e8,(Scalar *)&local_b8);
      local_a8 = 0.0;
      pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                          (pCVar11,&local_a8);
      local_98 = 0.0;
      pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                          (pCVar11,&local_98);
      local_38 = 0.0;
      pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                          (pCVar11,&local_38);
      local_40 = 1.0;
      pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                          (pCVar11,&local_40);
      local_48 = 0.0;
      pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                          (pCVar11,&local_48);
      local_50 = 0.0;
      pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                          (pCVar11,&local_50);
      local_58 = 0.0;
      pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                          (pCVar11,&local_58);
      local_60 = 0.0;
      pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                          (pCVar11,&local_60);
      local_68 = 1000.0;
      pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                          (pCVar11,&local_68);
      local_70 = 0.0;
      pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                          (pCVar11,&local_70);
      local_78 = 0.0;
      pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                          (pCVar11,&local_78);
      local_80 = 0.0;
      pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                          (pCVar11,&local_80);
      local_88 = 0.0;
      pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                          (pCVar11,&local_88);
      local_90 = 1000.0;
      Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                (pCVar11,&local_90);
      if (((local_e8.m_currentBlockRows + local_e8.m_row ==
            ((local_e8.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
            m_storage.m_rows) ||
          (((local_e8.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
           m_storage.m_cols == 0)) &&
         (local_e8.m_col ==
          ((local_e8.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
          m_storage.m_cols)) {
        if (measurement_pack->sensor_type_ == LASER) {
          lVar2 = (measurement_pack->raw_measurements_).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
          if (lVar2 < 1) {
LAB_00104891:
            __assert_fail("index >= 0 && index < size()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/toluwajosh[P]CarND-EKF-Project/src/Eigen/src/Core/DenseCoeffsBase.h"
                          ,0xad,
                          "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                         );
          }
          pdVar6 = (measurement_pack->raw_measurements_).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
          local_e8.m_row = 0;
          local_e8.m_col = 1;
          local_e8.m_currentBlockRows = 1;
          *(pVVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
               = *pdVar6;
          local_e8.m_xpr = (Matrix<double,__1,__1,_0,__1,__1> *)pVVar1;
          if (lVar2 == 1) goto LAB_00104891;
          pCVar12 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                              ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                               &local_e8,pdVar6 + 1);
          local_b8._vptr_Tools = (_func_int **)0x0;
          pCVar12 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                              (pCVar12,(Scalar *)&local_b8);
          local_a8 = 0.0;
          Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                    (pCVar12,&local_a8);
        }
        else {
          if (measurement_pack->sensor_type_ != RADAR) goto LAB_001047fa;
          lVar2 = (measurement_pack->raw_measurements_).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
          if (((lVar2 < 1) || (lVar2 == 1)) || (lVar2 < 3)) {
            __assert_fail("index >= 0 && index < size()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/toluwajosh[P]CarND-EKF-Project/src/Eigen/src/Core/DenseCoeffsBase.h"
                          ,0x9c,
                          "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator[](Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                         );
          }
          pdVar6 = (measurement_pack->raw_measurements_).
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
          local_b0 = *pdVar6;
          local_c0 = pdVar6[1];
          local_a0 = pdVar6[2];
          dVar10 = cos(local_c0);
          local_e8.m_row = 0;
          local_e8.m_col = 1;
          local_e8.m_currentBlockRows = 1;
          *(pVVar1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
               = dVar10 * local_b0;
          local_e8.m_xpr = (Matrix<double,__1,__1,_0,__1,__1> *)pVVar1;
          dVar10 = sin(local_c0);
          local_b8._vptr_Tools = (_func_int **)(dVar10 * local_b0);
          pCVar12 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                              ((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                               &local_e8,(Scalar *)&local_b8);
          local_a8 = cos(local_c0);
          local_a8 = local_a8 * local_a0;
          pCVar12 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                              (pCVar12,&local_a8);
          local_98 = sin(local_c0);
          local_98 = local_a0 * local_98;
          Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                    (pCVar12,&local_98);
        }
        if ((local_e8.m_currentBlockRows + local_e8.m_row ==
             ((local_e8.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
             m_storage.m_rows) && (local_e8.m_col == 1)) {
LAB_001047fa:
          this->previous_timestamp_ = measurement_pack->timestamp_;
          this->is_initialized_ = true;
          return;
        }
        goto LAB_00104853;
      }
    }
  }
  else {
    lVar2 = measurement_pack->timestamp_;
    lVar3 = this->previous_timestamp_;
    this->previous_timestamp_ = lVar2;
    lVar4 = (this->ekf_).F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
            m_storage.m_rows;
    if ((lVar4 < 1) ||
       (lVar5 = (this->ekf_).F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_cols, lVar5 < 3)) {
LAB_00104834:
      __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/toluwajosh[P]CarND-EKF-Project/src/Eigen/src/Core/DenseCoeffsBase.h"
                    ,0x151,
                    "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                   );
    }
    fVar15 = (float)((double)(lVar2 - lVar3) / 1000000.0);
    pdVar6 = (this->ekf_).F_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_data;
    pdVar6[lVar4 * 2] = (double)fVar15;
    if ((lVar4 == 1) || (lVar5 == 3)) goto LAB_00104834;
    local_b0 = (double)CONCAT44(local_b0._4_4_,fVar15 * fVar15);
    fVar14 = fVar15 * fVar15 * fVar15;
    pdVar6[lVar4 * 3 + 1] = (double)fVar15;
    local_e8.m_xpr = &(this->ekf_).Q_;
    fVar15 = fVar15 * fVar14 * 0.25;
    local_a0 = (double)CONCAT44(local_a0._4_4_,fVar15);
    local_e8.m_row = 0;
    local_e8.m_col = 1;
    local_e8.m_currentBlockRows = 1;
    *(this->ekf_).Q_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
     m_data = (double)(this->noise_ax * fVar15);
    local_b8._vptr_Tools = (_func_int **)0x0;
    local_c0._0_4_ = fVar14;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (&local_e8,(Scalar *)&local_b8);
    local_c0._0_4_ = local_c0._0_4_ * 0.5;
    local_a8 = (Scalar)(this->noise_ax * local_c0._0_4_);
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar11,&local_a8);
    local_98 = 0.0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar11,&local_98);
    local_38 = 0.0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar11,&local_38);
    local_40 = (Scalar)(local_a0._0_4_ * this->noise_ay);
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar11,&local_40);
    local_48 = 0.0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar11,&local_48);
    local_50 = (Scalar)(this->noise_ay * local_c0._0_4_);
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar11,&local_50);
    local_58 = (Scalar)(this->noise_ax * local_c0._0_4_);
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar11,&local_58);
    local_60 = 0.0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar11,&local_60);
    local_68 = (Scalar)(this->noise_ax * local_b0._0_4_);
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar11,&local_68);
    local_70 = 0.0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar11,&local_70);
    local_78 = 0.0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar11,&local_78);
    local_80 = (Scalar)(local_c0._0_4_ * this->noise_ay);
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar11,&local_80);
    local_88 = 0.0;
    pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                        (pCVar11,&local_88);
    local_90 = (Scalar)(local_b0._0_4_ * this->noise_ay);
    Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_(pCVar11,&local_90)
    ;
    if (((local_e8.m_currentBlockRows + local_e8.m_row ==
          ((local_e8.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
          m_storage.m_rows) ||
        (((local_e8.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
         m_storage.m_cols == 0)) &&
       (local_e8.m_col ==
        ((local_e8.m_xpr)->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
        m_storage.m_cols)) {
      this_00 = &this->ekf_;
      KalmanFilter::Predict(this_00);
      if (measurement_pack->sensor_type_ == RADAR) {
        Tools::Tools(&local_b8);
        Tools::CalculateJacobian((MatrixXd *)&local_e8,&local_b8,&(this->ekf_).x_);
        __ptr = (MatrixXd *)
                (this->ekf_).H_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data;
        (this->ekf_).H_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
        m_data = (double *)local_e8.m_xpr;
        DVar7 = (this->ekf_).H_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_rows;
        (this->ekf_).H_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
        m_rows = local_e8.m_row;
        DVar8 = (this->ekf_).H_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_cols;
        (this->ekf_).H_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
        m_cols = local_e8.m_col;
        local_e8.m_xpr = __ptr;
        local_e8.m_row = DVar7;
        local_e8.m_col = DVar8;
        free(__ptr);
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        lazyAssign<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&(this->ekf_).R_,
                   (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->R_radar_);
        KalmanFilter::UpdateEKF(this_00,&measurement_pack->raw_measurements_);
        Tools::~Tools(&local_b8);
      }
      else {
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        lazyAssign<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&(this->ekf_).H_,
                   (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->H_laser_);
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        lazyAssign<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&(this->ekf_).R_,
                   (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&this->R_laser_);
        KalmanFilter::Update(this_00,&measurement_pack->raw_measurements_);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"x_ = ",5);
      poVar13 = Eigen::operator<<((ostream *)&std::cout,
                                  (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                  &(this->ekf_).x_);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
      std::ostream::put((char)poVar13);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"P_ = ",5);
      poVar13 = Eigen::operator<<((ostream *)&std::cout,
                                  (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                                  &(this->ekf_).P_);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
      std::ostream::put((char)poVar13);
      std::ostream::flush();
      return;
    }
  }
  __function = 
  "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, -1>>::finished() [MatrixType = Eigen::Matrix<double, -1, -1>]"
  ;
LAB_00104868:
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/toluwajosh[P]CarND-EKF-Project/src/Eigen/src/Core/CommaInitializer.h"
                ,0x6f,__function);
}

Assistant:

void FusionEKF::ProcessMeasurement(const MeasurementPackage &measurement_pack) {

  /*****************************************************************************
   *  Initialization
   ****************************************************************************/

  if (!is_initialized_) {

    // Initialize the state ekf_.x_
    cout << "EKF: " << endl;
    ekf_.x_ = VectorXd(4);
    ekf_.x_ << 1, 1, 1, 1;

    // prediction covariance matrix
    ekf_.P_ = MatrixXd(4, 4);
    ekf_.F_ = MatrixXd(4, 4);
    ekf_.Q_ = MatrixXd(4, 4);

    // initialize transition matrix
    ekf_.F_ << 1, 0, 1, 0,
              0, 1, 0, 1,
              0, 0, 1, 0,
              0, 0, 0, 1;

    // initialize prediction covariance matrix
    ekf_.P_ << 1, 0, 0, 0,
              0, 1, 0, 0,
              0, 0, 1000, 0,
              0, 0, 0, 1000;
    
    if (measurement_pack.sensor_type_ == MeasurementPackage::RADAR) {
      
      // convert radar measurements from polar to cartesian
      // Set state ekf_.x_ to the first measurement.
      double ro = measurement_pack.raw_measurements_[0];
      double phi = measurement_pack.raw_measurements_[1];
      double ro_dot = measurement_pack.raw_measurements_[2];

      ekf_.x_ << ro * cos(phi), ro * sin(phi), ro_dot * cos(phi), ro_dot * sin(phi);
    }
    else if (measurement_pack.sensor_type_ == MeasurementPackage::LASER) {
      // Set state ekf_.x_ to the first measurement.
      ekf_.x_ << measurement_pack.raw_measurements_(0), measurement_pack.raw_measurements_(1), 0.0, 0.0;
    }

    previous_timestamp_ = measurement_pack.timestamp_;

    // done initializing
    is_initialized_ = true;
    return;
  }

  /*****************************************************************************
   *  Prediction
   ****************************************************************************/

  //compute the time elapsed between the current and previous measurements
  float dt = (measurement_pack.timestamp_ - previous_timestamp_) / 1000000.0;	//dt - expressed in seconds
  previous_timestamp_ = measurement_pack.timestamp_;

  float dt_2 = dt * dt;
  float dt_3 = dt_2 * dt;
  float dt_4 = dt_3 * dt;

  // update F matrix
  ekf_.F_(0, 2) = dt;
  ekf_.F_(1, 3) = dt;

  // Update the process covariance matrix Q
  // noise_ax = 9 and noise_ay = 9
  ekf_.Q_ << dt_4 / 4 * noise_ax, 0, dt_3 / 2 * noise_ax, 0,
    0, dt_4 / 4 * noise_ay, 0, dt_3 / 2 * noise_ay,
    dt_3 / 2 * noise_ax, 0, dt_2*noise_ax, 0,
    0, dt_3 / 2 * noise_ay, 0, dt_2*noise_ay;
  
  // predict
  
  //if (fabs(dt) > 0.001) {
  //  ekf_.Predict();
  //}
  ekf_.Predict();
  

  /*****************************************************************************
   *  Update: the state and covariance matrices.
   ****************************************************************************/

  if (measurement_pack.sensor_type_ == MeasurementPackage::RADAR) {
    
    // Radar updates
    Tools tools;
    ekf_.H_ = tools.CalculateJacobian(ekf_.x_);
    ekf_.R_ = R_radar_;
    ekf_.UpdateEKF(measurement_pack.raw_measurements_);
    
  } else {

    // Laser updates
    ekf_.H_ = H_laser_;
    ekf_.R_ = R_laser_;
    ekf_.Update(measurement_pack.raw_measurements_);
  }

  // print the output
  cout << "x_ = " << ekf_.x_ << endl;
  cout << "P_ = " << ekf_.P_ << endl;
}